

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManTransformToDual(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      iVar6 = pVVar9->pArray[lVar14];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001eb397;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar4 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_001eb3b6:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_001eb3b6;
      pGVar3[iVar6].Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar9 = p->vCis;
    } while (lVar14 < pVVar9->nSize);
  }
  iVar6 = p->nObjs;
  if (0 < iVar6) {
    lVar15 = 8;
    lVar14 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar4 = *(ulong *)((long)pGVar3 + lVar15 + -8);
      if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
        uVar11 = *(uint *)((long)pGVar3 +
                          lVar15 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3);
        if (((int)uVar11 < 0) ||
           (uVar13 = *(uint *)((long)pGVar3 +
                              lVar15 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar13 < 0)) goto LAB_001eb3d5;
        iVar6 = Gia_ManHashAnd(p_00,uVar11 ^ (uint)(uVar4 >> 0x1d) & 1,
                               uVar13 ^ (uint)(uVar4 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar15) = iVar6;
        iVar6 = p->nObjs;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar14 < iVar6);
  }
  iVar6 = p->nRegs;
  pVVar9 = p->vCos;
  iVar12 = pVVar9->nSize;
  if (iVar6 < iVar12) {
    lVar14 = 0;
    do {
      if (iVar12 <= lVar14) goto LAB_001eb3f4;
      iVar12 = pVVar9->pArray[lVar14];
      if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_001eb397;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar12;
      uVar13 = (uint)*(undefined8 *)pGVar3;
      uVar11 = pGVar3[-(ulong)(uVar13 & 0x1fffffff)].Value;
      if ((int)uVar11 < 0) goto LAB_001eb3d5;
      Gia_ManAppendCo(p_00,uVar13 >> 0x1d & 1 ^ uVar11);
      Gia_ManAppendCo(p_00,0);
      lVar14 = lVar14 + 1;
      iVar6 = p->nRegs;
      pVVar9 = p->vCos;
      iVar12 = pVVar9->nSize;
    } while (lVar14 < iVar12 - iVar6);
  }
  if (0 < iVar6) {
    iVar12 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar11 = (iVar1 - iVar6) + iVar12;
      if (((int)uVar11 < 0) || (iVar1 <= (int)uVar11)) {
LAB_001eb3f4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = p->vCos->pArray[uVar11];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_001eb397:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar6;
      if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_001eb3d5:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                    pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value
                              );
      pGVar3->Value = uVar11;
      iVar12 = iVar12 + 1;
      iVar6 = p->nRegs;
    } while (iVar12 < iVar6);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManTransformToDual( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}